

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexture::setSize(QOpenGLTexture *this,int width,int height,int depth)

{
  Target TVar1;
  bool bVar2;
  QOpenGLTexturePrivate *file;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QOpenGLTexturePrivate *in_RDI;
  long in_FS_OFFSET;
  QOpenGLTexturePrivate *d;
  Feature in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff88;
  WrapMode in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffa0;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QOpenGLTexture *)0x18c7e6);
  QOpenGLTexturePrivate::create((QOpenGLTexturePrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0))
  ;
  bVar2 = isStorageAllocated((QOpenGLTexture *)in_RDI);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),(char *)file,
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QMessageLogger::warning
              (local_28,
               "Cannot resize a texture that already has storage allocated.\nTo do so, destroy() the texture and then create() and setSize()"
              );
    goto LAB_0018c9ad;
  }
  bVar2 = isNpot(in_ESI,in_EDX,in_ECX);
  if (((bVar2) && (bVar2 = hasFeature(in_stack_000000e0), !bVar2)) &&
     (file->target != TargetRectangle)) {
    QOpenGLTexturePrivate::setWrapMode(in_RDI,in_stack_ffffffffffffff8c);
  }
  TVar1 = file->target;
  if (TVar1 == Target1D) goto LAB_0018c918;
  if (TVar1 != Target2D) {
    if (TVar1 == Target3D) {
      file->dimensions[0] = in_ESI;
      file->dimensions[1] = in_EDX;
      file->dimensions[2] = in_ECX;
      goto LAB_0018c9ad;
    }
    if (TVar1 != TargetRectangle) {
      if (TVar1 == TargetCubeMap) {
LAB_0018c943:
        if (in_ESI != in_EDX) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),(char *)file,
                     (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(TVar1,in_stack_ffffffffffffff88))
          ;
          QMessageLogger::warning
                    (local_48,"QAbstractOpenGLTexture::setSize(): Cube map textures must be square")
          ;
        }
        file->dimensions[1] = in_ESI;
        file->dimensions[0] = in_ESI;
        goto LAB_0018c9ad;
      }
      if (TVar1 == Target1DArray) {
LAB_0018c918:
        file->dimensions[0] = in_ESI;
        goto LAB_0018c9ad;
      }
      if (TVar1 != Target2DArray) {
        if (TVar1 == TargetBuffer) goto LAB_0018c918;
        if (TVar1 == TargetCubeMapArray) goto LAB_0018c943;
        if ((TVar1 != Target2DMultisample) && (TVar1 != Target2DMultisampleArray))
        goto LAB_0018c9ad;
      }
    }
  }
  file->dimensions[0] = in_ESI;
  file->dimensions[1] = in_EDX;
LAB_0018c9ad:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTexture::setSize(int width, int height, int depth)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot resize a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setSize()");
        return;
    }

    if (isNpot(width, height, depth) && !hasFeature(Feature::NPOTTextureRepeat) && d->target != Target::TargetRectangle)
        d->setWrapMode(WrapMode::ClampToEdge);

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        d->dimensions[0] = width;
        Q_UNUSED(height);
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
        if (width != height)
            qWarning("QAbstractOpenGLTexture::setSize(): Cube map textures must be square");
        d->dimensions[0] = d->dimensions[1] = width;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target3D:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        d->dimensions[2] = depth;
        break;
    }
}